

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O1

int CVodeSetJacEvalFrequency(void *cvode_mem,long msbj)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_20;
  CVodeMem local_18;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeSetJacEvalFrequency",&local_18,&local_20);
  if (iVar1 == 0) {
    if (msbj < 0) {
      iVar1 = -3;
      cvProcessError(local_18,-3,0x19e,"CVodeSetJacEvalFrequency",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                     ,"A negative evaluation frequency was provided.");
    }
    else {
      if (msbj == 0) {
        msbj = 0x33;
      }
      local_20->msbj = msbj;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int CVodeSetJacEvalFrequency(void* cvode_mem, long int msbj)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure; store input and return */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Check for legal msbj */
  if (msbj < 0)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "A negative evaluation frequency was provided.");
    return (CVLS_ILL_INPUT);
  }

  cvls_mem->msbj = (msbj == 0) ? CVLS_MSBJ : msbj;

  return (CVLS_SUCCESS);
}